

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

Token nexttoken(Context_conflict2 *ctx)

{
  int iVar1;
  char *pcVar2;
  uint local_14;
  Context_conflict2 *pCStack_10;
  uint line;
  Context_conflict2 *ctx_local;
  
  pCStack_10 = ctx;
  if (ctx->pushedback == 0) {
    while( true ) {
      pcVar2 = preprocessor_nexttoken
                         (pCStack_10->preprocessor,&pCStack_10->tokenlen,&pCStack_10->tokenval);
      pCStack_10->token = pcVar2;
      iVar1 = preprocessor_outofmemory(pCStack_10->preprocessor);
      if (iVar1 != 0) break;
      pcVar2 = preprocessor_sourcepos(pCStack_10->preprocessor,&local_14);
      pCStack_10->current_file = pcVar2;
      pCStack_10->current_position = local_14;
      if (pCStack_10->tokenval == TOKEN_BAD_CHARS) {
        fail(pCStack_10,"Bad characters in source file");
      }
      else {
        if (pCStack_10->tokenval != TOKEN_PREPROCESSING_ERROR) goto LAB_00157347;
        fail(pCStack_10,pCStack_10->token);
      }
    }
    pCStack_10->tokenval = TOKEN_EOI;
    pCStack_10->token = (char *)0x0;
    pCStack_10->tokenlen = 0;
  }
  else {
    ctx->pushedback = 0;
  }
LAB_00157347:
  return pCStack_10->tokenval;
}

Assistant:

static Token nexttoken(Context *ctx)
{
    if (ctx->pushedback)
        ctx->pushedback = 0;
    else
    {
        while (1)
        {
            ctx->token = preprocessor_nexttoken(ctx->preprocessor,
                                                &ctx->tokenlen,
                                                &ctx->tokenval);

            if (preprocessor_outofmemory(ctx->preprocessor))
            {
                ctx->tokenval = TOKEN_EOI;
                ctx->token = NULL;
                ctx->tokenlen = 0;
                break;
            } // if

            unsigned int line;
            ctx->current_file = preprocessor_sourcepos(ctx->preprocessor,&line);
            ctx->current_position = (int) line;

            if (ctx->tokenval == TOKEN_BAD_CHARS)
            {
                fail(ctx, "Bad characters in source file");
                continue;
            } // else if

            else if (ctx->tokenval == TOKEN_PREPROCESSING_ERROR)
            {
                fail(ctx, ctx->token);
                continue;
            } // else if

            break;
        } // while
    } // else

    print_debug_token(ctx->token, ctx->tokenlen, ctx->tokenval);
    return ctx->tokenval;
}